

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::fixup(QDateTimeEdit *this,QString *input)

{
  QString *input_00;
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QDateTime value;
  int copy;
  State state;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  undefined1 *local_38;
  State local_30;
  undefined4 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  input_00 = *(QString **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_2c = 0xaaaaaaaa;
  local_30 = QLineEdit::cursorPosition((QLineEdit *)input_00[0x25].d.d);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTimeEditPrivate::validateAndInterpret
            ((QDateTimeEditPrivate *)&stack0xffffffffffffffc8,input_00,(int *)input,
             &stack0xffffffffffffffd0,SUB81(&stack0xffffffffffffffd4,0));
  if ((int)input_00[0x27].d.size == 1) {
    (**(code **)(*(long *)&(this->super_QAbstractSpinBox).super_QWidget + 0x1d8))
              (&local_58,this,&stack0xffffffffffffffc8);
    pQVar1 = &((input->d).d)->super_QArrayData;
    pcVar2 = (input->d).ptr;
    (input->d).d = (Data *)local_58;
    (input->d).ptr = pcStack_50;
    qVar3 = (input->d).size;
    (input->d).size = local_48;
    local_58 = pQVar1;
    pcStack_50 = pcVar2;
    local_48 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::fixup(QString &input) const
{
    Q_D(const QDateTimeEdit);
    QValidator::State state;
    int copy = d->edit->cursorPosition();

    QDateTime value = d->validateAndInterpret(input, copy, state, true);
    // CorrectToPreviousValue correction is handled by QAbstractSpinBox.
    // The value might not match the input if the input represents a date-time
    // skipped over by its time representation, such as a spring-forward.
    if (d->correctionMode == QAbstractSpinBox::CorrectToNearestValue)
        input = textFromDateTime(value);
}